

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O2

void __thiscall
QNetworkRequestFactory::setAttribute
          (QNetworkRequestFactory *this,Attribute attribute,QVariant *value)

{
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  Attribute local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = attribute;
  if ((attribute < RedirectPolicyAttribute) &&
     ((0x30024fU >> (attribute & (UseCredentialsAttribute|ConnectionEncryptedAttribute)) & 1) != 0))
  {
    lcQrequestfactory();
    if (((byte)lcQrequestfactory::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_30 = lcQrequestfactory::category.name;
      QMessageLogger::warning(local_48,"%i is a reply-only attribute, ignoring.",attribute);
    }
  }
  else {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(&this->d);
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&((this->d).d.ptr)->attributes,
               &local_24,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequestFactory::setAttribute(QNetworkRequest::Attribute attribute,
                                          const QVariant &value)
{
    if (attribute == QNetworkRequest::HttpStatusCodeAttribute
        || attribute == QNetworkRequest::HttpReasonPhraseAttribute
        || attribute == QNetworkRequest::RedirectionTargetAttribute
        || attribute == QNetworkRequest::ConnectionEncryptedAttribute
        || attribute == QNetworkRequest::SourceIsFromCacheAttribute
        || attribute == QNetworkRequest::HttpPipeliningWasUsedAttribute
        || attribute == QNetworkRequest::Http2WasUsedAttribute
        || attribute == QNetworkRequest::OriginalContentLengthAttribute)
    {
        qCWarning(lcQrequestfactory, "%i is a reply-only attribute, ignoring.", attribute);
        return;
    }
    d.detach();
    d->attributes.insert(attribute, value);
}